

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::array<tinyusdz::value::half,_3UL>_> * __thiscall
tinyusdz::XformOp::get_value<std::array<tinyusdz::value::half,3ul>>
          (optional<std::array<tinyusdz::value::half,_3UL>_> *__return_storage_ptr__,XformOp *this,
          double t,TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_34;
  array<tinyusdz::value::half,_3UL> local_2a;
  undefined1 auStack_24 [2];
  array<tinyusdz::value::half,_3UL> value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  _auStack_24 = interp;
  unique0x100000bb = t;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<std::array<tinyusdz::value::half,3ul>>
                      (this,&local_2a,stack0xffffffffffffffe0,_auStack_24);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
      optional<std::array<tinyusdz::value::half,_3UL>,_0>(__return_storage_ptr__,&local_2a);
    }
    else {
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::optional
                (__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<std::array<tinyusdz::value::half,3ul>>(&local_34,&this->_var);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::
    optional<std::array<tinyusdz::value::half,_3UL>,_0>(__return_storage_ptr__,&local_34);
    nonstd::optional_lite::optional<std::array<tinyusdz::value::half,_3UL>_>::~optional(&local_34);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }